

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_AddNodes(UA_Server *server,UA_Session *session,UA_AddNodesRequest *request,
                     UA_AddNodesResponse *response)

{
  UA_StatusCode UVar1;
  UA_AddNodesResult *pUVar2;
  long lVar3;
  size_t __nmemb;
  long lVar4;
  
  __nmemb = request->nodesToAddSize;
  if (__nmemb == 0) {
    UVar1 = 0x800f0000;
  }
  else {
    pUVar2 = (UA_AddNodesResult *)calloc(__nmemb,0x20);
    response->results = pUVar2;
    if (pUVar2 != (UA_AddNodesResult *)0x0) {
      response->resultsSize = __nmemb;
      lVar3 = 0;
      lVar4 = 0;
      do {
        Service_AddNodes_single
                  (server,session,
                   (UA_AddNodesItem *)
                   ((long)&(request->nodesToAdd->parentNodeId).nodeId.namespaceIndex + lVar3),
                   (UA_AddNodesResult *)((long)&response->results->statusCode + lVar4),
                   (UA_InstantiationCallback *)0x0);
        lVar4 = lVar4 + 0x20;
        lVar3 = lVar3 + 0xf8;
        __nmemb = __nmemb - 1;
      } while (__nmemb != 0);
      return;
    }
    UVar1 = 0x80030000;
  }
  (response->responseHeader).serviceResult = UVar1;
  return;
}

Assistant:

void Service_AddNodes(UA_Server *server, UA_Session *session,
                      const UA_AddNodesRequest *request,
                      UA_AddNodesResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing AddNodesRequest");
    if(request->nodesToAddSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }
    size_t size = request->nodesToAddSize;

    response->results = UA_Array_new(size, &UA_TYPES[UA_TYPES_ADDNODESRESULT]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }

#ifdef UA_ENABLE_EXTERNAL_NAMESPACES
#ifdef _MSC_VER
    UA_Boolean *isExternal = UA_alloca(size);
    UA_UInt32 *indices = UA_alloca(sizeof(UA_UInt32)*size);
#else
    UA_Boolean isExternal[size];
    UA_UInt32 indices[size];
#endif
    memset(isExternal, false, sizeof(UA_Boolean) * size);
    for(size_t j = 0; j <server->externalNamespacesSize; ++j) {
        size_t indexSize = 0;
        for(size_t i = 0;i < size;++i) {
            if(request->nodesToAdd[i].requestedNewNodeId.nodeId.namespaceIndex !=
               server->externalNamespaces[j].index)
                continue;
            isExternal[i] = true;
            indices[indexSize] = (UA_UInt32)i;
            ++indexSize;
        }
        if(indexSize == 0)
            continue;
        UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
        ens->addNodes(ens->ensHandle, &request->requestHeader,
                      request->nodesToAdd, indices, (UA_UInt32)indexSize,
                      response->results, response->diagnosticInfos);
    }
#endif

    response->resultsSize = size;
    for(size_t i = 0; i < size; ++i) {
#ifdef UA_ENABLE_EXTERNAL_NAMESPACES
        if(!isExternal[i])
#endif
            Service_AddNodes_single(server, session, &request->nodesToAdd[i],
                                    &response->results[i], NULL);
    }
}